

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_short>::resize
          (ImageTemplate<unsigned_short> *this,uint32_t width_,uint32_t height_)

{
  byte bVar1;
  uint32_t uVar2;
  unsigned_short *puVar3;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_short> *in_RDI;
  uint32_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint32_t uVar4;
  
  if (((in_ESI != 0) && (in_EDX != 0)) &&
     ((in_ESI != in_RDI->_width || (in_EDX != in_RDI->_height)))) {
    clear((ImageTemplate<unsigned_short> *)
          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    in_RDI->_width = in_ESI;
    in_RDI->_height = in_EDX;
    uVar2 = width(in_RDI);
    bVar1 = colorCount(in_RDI);
    in_RDI->_rowSize = uVar2 * bVar1;
    uVar4 = in_RDI->_rowSize;
    bVar1 = alignment(in_RDI);
    if (uVar4 % (uint)bVar1 != 0) {
      in_stack_ffffffffffffffd8 = in_RDI->_rowSize;
      bVar1 = alignment(in_RDI);
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffd8 / bVar1 + 1;
      bVar1 = alignment(in_RDI);
      in_RDI->_rowSize = in_stack_ffffffffffffffdc * (uint)bVar1;
    }
    puVar3 = _allocate((ImageTemplate<unsigned_short> *)CONCAT44(uVar4,uVar2),
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    in_RDI->_data = puVar3;
  }
  return;
}

Assistant:

void resize( uint32_t width_, uint32_t height_ )
        {
            if( width_ > 0 && height_ > 0 && (width_ != _width || height_ != _height) ) {
                clear();

                _width  = width_;
                _height = height_;

                _rowSize = width() * colorCount();
                if( _rowSize % alignment() != 0 )
                    _rowSize = (_rowSize / alignment() + 1) * alignment();

                _data = _allocate( _height * _rowSize );
            }
        }